

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::make_constant<std::__cxx11::string,std::__cxx11::string_const&>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((DAT_002592c0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x28);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<cs::pointer>::allocator + DAT_002592c0 * 8);
    DAT_002592c0 = DAT_002592c0 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_0024fe38;
  pbVar2[1]._vptr_baseHolder = (_func_int **)(pbVar2 + 3);
  pcVar1 = (args->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar2 + 1),pcVar1,pcVar1 + args->_M_string_length);
  if ((DAT_0025be20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_0025be20];
    DAT_0025be20 = DAT_0025be20 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 2;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}